

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

XML_Convert_Result unknown_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  int c_00;
  char *pcVar1;
  int local_54;
  int c;
  int n;
  char *utf8;
  ENCODING *pEStack_40;
  char buf [4];
  unknown_encoding *uenc;
  char *toLim_local;
  char **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  pEStack_40 = enc;
  do {
    if (*fromP == fromLim) {
      return XML_CONVERT_COMPLETED;
    }
    pcVar1 = (char *)((long)pEStack_40[7].literalScanners + (ulong)(byte)**fromP * 4 + 0x40);
    _c = pcVar1 + 1;
    local_54 = (int)*pcVar1;
    if (local_54 == 0) {
      c_00 = (*pEStack_40[3].charRefNumber)((ENCODING *)pEStack_40[3].predefinedEntityName,*fromP);
      local_54 = XmlUtf8Encode(c_00,(char *)((long)&utf8 + 4));
      if ((long)toLim - (long)*toP < (long)local_54) {
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      _c = (char *)((long)&utf8 + 4);
      *fromP = *fromP + (int)(*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3);
    }
    else {
      if ((long)toLim - (long)*toP < (long)local_54) {
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      *fromP = *fromP + 1;
    }
    memcpy(*toP,_c,(long)local_54);
    *toP = *toP + local_54;
  } while( true );
}

Assistant:

static enum XML_Convert_Result PTRCALL
unknown_toUtf8(const ENCODING *enc, const char **fromP, const char *fromLim,
               char **toP, const char *toLim) {
  const struct unknown_encoding *uenc = AS_UNKNOWN_ENCODING(enc);
  char buf[XML_UTF8_ENCODE_MAX];
  for (;;) {
    const char *utf8;
    int n;
    if (*fromP == fromLim)
      return XML_CONVERT_COMPLETED;
    utf8 = uenc->utf8[(unsigned char)**fromP];
    n = *utf8++;
    if (n == 0) {
      int c = uenc->convert(uenc->userData, *fromP);
      n = XmlUtf8Encode(c, buf);
      if (n > toLim - *toP)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      utf8 = buf;
      *fromP += (AS_NORMAL_ENCODING(enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2));
    } else {
      if (n > toLim - *toP)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      (*fromP)++;
    }
    memcpy(*toP, utf8, n);
    *toP += n;
  }
}